

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fClippingTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::anon_unknown_0::LineCase::verifyImage
          (LineCase *this,ConstPixelBufferAccess *testImageAccess,
          ConstPixelBufferAccess *referenceImageAccess)

{
  ostringstream *poVar1;
  float fVar2;
  TextureFormat log;
  int iVar3;
  RenderTarget *pRVar4;
  MessageBuilder *this_00;
  PixelBufferAccess *diffMask_00;
  ConstPixelBufferAccess *pCVar5;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  char *description;
  ChannelOrder __fd;
  qpTestResult testResult;
  allocator<char> local_4f4;
  allocator<char> local_4f3;
  allocator<char> local_4f2;
  allocator<char> local_4f1;
  allocator<char> local_4f0;
  allocator<char> local_4ef;
  allocator<char> local_4ee;
  allocator<char> local_4ed;
  int local_4ec;
  ConstPixelBufferAccess *local_4e8;
  Surface diffMask;
  string local_4c8;
  string local_4a8;
  string local_488;
  string local_468;
  string local_448;
  string local_428;
  string local_408;
  string local_3e8;
  LogImageSet local_3c8;
  ConstPixelBufferAccess local_388;
  undefined1 local_360 [384];
  LogImage local_1e0;
  LogImage local_150;
  LogImage local_c0;
  
  local_4e8 = referenceImageAccess;
  pRVar4 = Context::getRenderTarget
                     ((this->super_LineRenderTestCase).super_RenderTestCase.super_TestCase.m_context
                     );
  local_4ec = pRVar4->m_numSamples;
  log = (TextureFormat)
        ((this->super_LineRenderTestCase).super_RenderTestCase.super_TestCase.super_TestCase.
         super_TestNode.m_testCtx)->m_log;
  tcu::Surface::Surface(&diffMask,200,200);
  poVar1 = (ostringstream *)(local_360 + 8);
  local_360._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Comparing images... ");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_360,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  poVar1 = (ostringstream *)(local_360 + 8);
  local_360._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Deviation within radius of ");
  this_00 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_360,&this->m_searchKernelSize);
  std::operator<<(&(this_00->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                  " is allowed.");
  tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  poVar1 = (ostringstream *)(local_360 + 8);
  local_360._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::ostream::operator<<(poVar1,6);
  std::operator<<((ostream *)poVar1," faulty pixels are allowed.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_360,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  tcu::Surface::getAccess((PixelBufferAccess *)local_360,&diffMask);
  diffMask_00 = (PixelBufferAccess *)local_360;
  iVar3 = compareBlackNonBlackImages
                    ((TestLog *)log,testImageAccess,local_4e8,diffMask_00,this->m_searchKernelSize);
  if (6 < iVar3) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e8,"Images",&local_4ed);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_408,"Image comparison",&local_4ee);
    tcu::LogImageSet::LogImageSet(&local_3c8,&local_3e8,&local_408);
    __fd = log.order;
    tcu::LogImageSet::write(&local_3c8,__fd,__buf,(size_t)diffMask_00);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_428,"TestImage",&local_4ef);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_448,"Test image",&local_4f0)
    ;
    tcu::LogImage::LogImage
              (&local_c0,&local_428,&local_448,testImageAccess,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_c0,__fd,__buf_00,(size_t)testImageAccess);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_468,"ReferenceImage",&local_4f1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_488,"Reference image",&local_4f2);
    pCVar5 = local_4e8;
    tcu::LogImage::LogImage
              (&local_150,&local_468,&local_488,local_4e8,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_150,__fd,__buf_01,(size_t)pCVar5);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4a8,"DifferenceMask",&local_4f3);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4c8,"Difference mask",&local_4f4);
    tcu::Surface::getAccess((PixelBufferAccess *)&local_388,&diffMask);
    pCVar5 = &local_388;
    tcu::LogImage::LogImage(&local_1e0,&local_4a8,&local_4c8,pCVar5,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_1e0,__fd,__buf_02,(size_t)pCVar5);
    tcu::TestLog::endImageSet((TestLog *)log);
    poVar1 = (ostringstream *)(local_360 + 8);
    local_360._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Got ");
    std::ostream::operator<<(poVar1,iVar3);
    std::operator<<((ostream *)poVar1," faulty pixel(s).");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_360,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    tcu::LogImage::~LogImage(&local_1e0);
    std::__cxx11::string::~string((string *)&local_4c8);
    std::__cxx11::string::~string((string *)&local_4a8);
    tcu::LogImage::~LogImage(&local_150);
    std::__cxx11::string::~string((string *)&local_488);
    std::__cxx11::string::~string((string *)&local_468);
    tcu::LogImage::~LogImage(&local_c0);
    std::__cxx11::string::~string((string *)&local_448);
    std::__cxx11::string::~string((string *)&local_428);
    tcu::LogImageSet::~LogImageSet(&local_3c8);
    std::__cxx11::string::~string((string *)&local_408);
    std::__cxx11::string::~string((string *)&local_3e8);
    description = "Got faulty pixels";
    testResult = QP_TEST_RESULT_FAIL;
    if ((1 < local_4ec) &&
       ((fVar2 = (this->super_LineRenderTestCase).m_lineWidth, fVar2 != 1.0 || (NAN(fVar2))))) {
      poVar1 = (ostringstream *)(local_360 + 8);
      local_360._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,
                      "Wide line support is optional, reporting compatibility warning.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_360,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      description = "Wide line clipping failed";
      testResult = QP_TEST_RESULT_COMPATIBILITY_WARNING;
    }
    tcu::TestContext::setTestResult
              ((this->super_LineRenderTestCase).super_RenderTestCase.super_TestCase.super_TestCase.
               super_TestNode.m_testCtx,testResult,description);
  }
  tcu::Surface::~Surface(&diffMask);
  return;
}

Assistant:

void LineCase::verifyImage (const tcu::ConstPixelBufferAccess& testImageAccess, const tcu::ConstPixelBufferAccess& referenceImageAccess)
{
	const int		faultyLimit		= 6;
	int				faultyPixels;

	const bool		isMsaa			= m_context.getRenderTarget().getNumSamples() > 1;
	tcu::TestLog&	log				= m_testCtx.getLog();
	tcu::Surface	diffMask		(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);

	log << TestLog::Message << "Comparing images... " << TestLog::EndMessage;
	log << TestLog::Message << "Deviation within radius of " << m_searchKernelSize << " is allowed." << TestLog::EndMessage;
	log << TestLog::Message << faultyLimit << " faulty pixels are allowed." << TestLog::EndMessage;

	faultyPixels = compareBlackNonBlackImages(log, testImageAccess, referenceImageAccess, diffMask.getAccess(), m_searchKernelSize);

	if (faultyPixels > faultyLimit)
	{
		log << TestLog::ImageSet("Images", "Image comparison")
			<< TestLog::Image("TestImage", "Test image", testImageAccess)
			<< TestLog::Image("ReferenceImage", "Reference image", referenceImageAccess)
			<< TestLog::Image("DifferenceMask", "Difference mask", diffMask.getAccess())
			<< TestLog::EndImageSet
			<< tcu::TestLog::Message << "Got " << faultyPixels << " faulty pixel(s)." << tcu::TestLog::EndMessage;

		if (m_lineWidth != 1.0f && isMsaa)
		{
			log << TestLog::Message << "Wide line support is optional, reporting compatibility warning." << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Wide line clipping failed");
		}
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got faulty pixels");
	}
}